

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O3

ngx_int_t ngx_http_variable_document_root
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  void *pvVar1;
  u_char *puVar2;
  ngx_int_t nVar3;
  ngx_str_t *pnVar4;
  undefined1 local_30 [8];
  ngx_str_t path;
  
  pvVar1 = r->loc_conf[ngx_http_core_module.ctx_index];
  if (*(undefined8 **)((long)pvVar1 + 0x78) == (undefined8 *)0x0) {
    *(uint *)v = (*(uint *)((long)pvVar1 + 0x58) & 0xfffffff) + (*(uint *)v & 0x80000000) +
                 0x10000000;
    pnVar4 = (ngx_str_t *)((long)pvVar1 + 0x60);
  }
  else {
    puVar2 = ngx_http_script_run(r,(ngx_str_t *)local_30,
                                 (void *)**(undefined8 **)((long)pvVar1 + 0x78),0,
                                 (void *)**(undefined8 **)((long)pvVar1 + 0x80));
    if (puVar2 == (u_char *)0x0) {
      return -1;
    }
    nVar3 = ngx_get_full_name(r->pool,&ngx_cycle->prefix,(ngx_str_t *)local_30);
    if (nVar3 != 0) {
      return -1;
    }
    pnVar4 = &path;
    *(uint *)v = (local_30._0_4_ & 0xfffffff) + (*(uint *)v & 0x80000000) + 0x10000000;
  }
  v->data = (u_char *)pnVar4->len;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_document_root(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    ngx_str_t                  path;
    ngx_http_core_loc_conf_t  *clcf;

    clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);

    if (clcf->root_lengths == NULL) {
        v->len = clcf->root.len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = clcf->root.data;

    } else {
        if (ngx_http_script_run(r, &path, clcf->root_lengths->elts, 0,
                                clcf->root_values->elts)
            == NULL)
        {
            return NGX_ERROR;
        }

        if (ngx_get_full_name(r->pool, (ngx_str_t *) &ngx_cycle->prefix, &path)
            != NGX_OK)
        {
            return NGX_ERROR;
        }

        v->len = path.len;
        v->valid = 1;
        v->no_cacheable = 0;
        v->not_found = 0;
        v->data = path.data;
    }

    return NGX_OK;
}